

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O1

int eeprom_writealias(int slave,int alias,uint16 crc)

{
  undefined3 in_EAX;
  int iVar1;
  int iVar2;
  undefined6 in_register_00000012;
  uint uVar3;
  uint8 eepctl;
  undefined4 uStack_38;
  undefined4 local_34;
  
  iVar2 = 0;
  if (((alias < 0x10000) && (0 < slave)) && (slave <= _ec_slavecount)) {
    uStack_38 = CONCAT13(2,in_EAX);
    _uStack_38 = CONCAT44((int)CONCAT62(in_register_00000012,crc),uStack_38);
    uVar3 = 1U - slave & 0xffff;
    ec_APWR(uVar3,0x500,1,(long)&uStack_38 + 3,2000);
    uStack_38 = (uint)(uint3)uStack_38;
    ec_APWR(uVar3,0x500,1,(long)&uStack_38 + 3,2000);
    iVar1 = ec_writeeepromAP(uVar3,4,alias & 0xffff,20000);
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar2 = ec_writeeepromAP(1U - slave & 0xffff,7,(undefined2)local_34,20000);
    }
  }
  return iVar2;
}

Assistant:

int eeprom_writealias(int slave, int alias, uint16 crc)
{
   int wkc;
   uint16 aiadr;
   uint8 eepctl;
   int ret;
   
   if((ec_slavecount >= slave) && (slave > 0) && (alias <= 0xffff))
   {
      aiadr = 1 - slave;
      eepctl = 2;
      wkc = ec_APWR(aiadr, ECT_REG_EEPCFG, sizeof(eepctl), &eepctl , EC_TIMEOUTRET); /* force Eeprom from PDI */
      eepctl = 0;
      wkc = ec_APWR(aiadr, ECT_REG_EEPCFG, sizeof(eepctl), &eepctl , EC_TIMEOUTRET); /* set Eeprom to master */

      ret = ec_writeeepromAP(aiadr, 0x04 , alias, EC_TIMEOUTEEP);
      if (ret)
        ret = ec_writeeepromAP(aiadr, 0x07 , crc, EC_TIMEOUTEEP);
        
      return ret;
   }
   
   return 0;
}